

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.hpp
# Opt level: O1

void __thiscall Character::~Character(Character *this)

{
  pointer pSVar1;
  void *pvVar2;
  long lVar3;
  
  pSVar1 = (this->orangePortal).animation.frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1);
  }
  pSVar1 = (this->bluePortal).animation.frames.
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1);
  }
  lVar3 = 0xd8;
  do {
    pvVar2 = *(void **)((long)this->animations + lVar3 + -0x10);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Character(glm::vec2 center, glm::vec2 halfDimension)
        : AABB(center, halfDimension)
        , state(IDLE)
        , towardsLeft(false)
        , grounded(false)
        , velocity(0.0f, 0.0f)
        , runAcceleration(0.0f, 0.0f)
        , jumpAcceleration(0.0f, 0.0f)
        , invincible(false)
        , timeOfDeathInMillis(-1)
        , lives(3)
        , bluePortal(true)
        , orangePortal(false)
    {}